

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool rcg::saveFile(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,string *data,
                  bool exception)

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  invalid_argument *piVar4;
  char *pcVar5;
  size_type sVar6;
  bool bVar7;
  allocator local_1d9;
  FileProtocolAdapter rf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream out;
  
  GenApi_3_4::FileProtocolAdapter::FileProtocolAdapter(&rf);
  GenApi_3_4::FileProtocolAdapter::attach((INodeMap *)&rf);
  cVar1 = GenApi_3_4::FileProtocolAdapter::openFile((char *)&rf,(_Ios_Openmode)name);
  if (cVar1 == '\0') {
    if (exception) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_1c8,"Cannot open file for writing: ",&local_1d9)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     &local_1c8,name);
      std::invalid_argument::invalid_argument(piVar4,(string *)&out);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar7 = false;
  }
  else {
    sVar6 = 0;
    lVar2 = 0x200;
    while (lVar2 != 0) {
      pcVar5 = (char *)(data->_M_string_length - sVar6);
      if ((char *)0x1ff < pcVar5) {
        pcVar5 = (char *)0x200;
      }
      lVar2 = GenApi_3_4::FileProtocolAdapter::write
                        ((char *)&rf,(long)((data->_M_dataplus)._M_p + sVar6),sVar6,pcVar5);
      sVar6 = sVar6 + lVar2;
    }
    GenApi_3_4::FileProtocolAdapter::closeFile((char *)&rf);
    bVar7 = sVar6 == data->_M_string_length;
    if (exception && !bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      poVar3 = std::operator<<((ostream *)&out,"Error: Can only write ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," of ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," bytes");
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_1c8);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  GenApi_3_4::FileProtocolAdapter::~FileProtocolAdapter(&rf);
  return bVar7;
}

Assistant:

bool saveFile(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  const std::string &data, bool exception)
{
  bool ret=true;

  // store in pieces of 512 bytes

  GenApi::FileProtocolAdapter rf;
  rf.attach(nodemap->_Ptr);

  if (rf.openFile(name, std::ios::out))
  {
    size_t off=0, n=512;
    while (n > 0)
    {
      n=rf.write(data.c_str()+off, off, std::min(static_cast<size_t>(512), data.size()-off), name);
      off+=n;
    }

    rf.closeFile(name);

    if (off != data.size())
    {
      if (exception)
      {
        std::ostringstream out;
        out << "Error: Can only write " << off << " of " << data.size() << " bytes";
        throw std::invalid_argument(out.str());
      }

      ret=false;
    }
  }
  else
  {
    if (exception)
    {
      throw std::invalid_argument(std::string("Cannot open file for writing: ")+name);
    }

    ret=false;
  }

  return ret;
}